

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_msa(CPUMIPSState_conflict8 *env,DisasContext_conflict6 *ctx)

{
  uint uVar1;
  uint uVar2;
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar3;
  int32_t iVar4;
  TCGv_i32 arg2;
  TCGv_i64 addr;
  TCGv_i64 taddr;
  TCGv_i32 twd;
  uint8_t df;
  uint8_t wd;
  uint8_t rs;
  int32_t s10;
  uint32_t opcode;
  TCGContext_conflict6 *tcg_ctx;
  DisasContext_conflict6 *ctx_local;
  CPUMIPSState_conflict8 *env_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  check_insn(ctx,0x20000000000);
  check_msa_access(ctx);
  switch(((ulong)(uVar1 & 0xfc000000) - 0x78000000) + (ulong)(uVar1 & 0x3f)) {
  case 0:
  case 1:
  case 2:
    gen_msa_i8(env,ctx);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 6:
  case 7:
    gen_msa_i5(env,ctx);
    break;
  case 9:
  case 10:
    gen_msa_bit(env,ctx);
    break;
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
    gen_msa_3r(env,ctx);
    break;
  case 0x19:
    gen_msa_elm(env,ctx);
    break;
  case 0x1a:
  case 0x1b:
  case 0x1c:
    gen_msa_3rf(env,ctx);
    break;
  case 0x1e:
    gen_msa_vec(env,ctx);
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    iVar4 = sextract32(ctx->opcode,0x10,10);
    uVar2 = ctx->opcode;
    uVar3 = ctx->opcode;
    arg2 = tcg_const_i32_mips64el(tcg_ctx_00,(uint)((byte)(ctx->opcode >> 6) & 0x1f));
    addr = tcg_temp_new_i64(tcg_ctx_00);
    gen_base_offset_addr(ctx,addr,(uint)((byte)(uVar2 >> 0xb) & 0x1f),iVar4 << ((byte)uVar3 & 3));
    switch(((ulong)(uVar1 & 0xfc000000) - 0x78000020) + (ulong)(uVar1 & 0x3f)) {
    case 0:
      gen_helper_msa_ld_b(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 1:
      gen_helper_msa_ld_h(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 2:
      gen_helper_msa_ld_w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 3:
      gen_helper_msa_ld_d(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 4:
      gen_helper_msa_st_b(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 5:
      gen_helper_msa_st_h(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 6:
      gen_helper_msa_st_w(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
      break;
    case 7:
      gen_helper_msa_st_d(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2,addr);
    }
    tcg_temp_free_i32(tcg_ctx_00,arg2);
    tcg_temp_free_i64(tcg_ctx_00,addr);
  }
  return;
}

Assistant:

static void gen_msa(CPUMIPSState *env, DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t opcode = ctx->opcode;
    check_insn(ctx, ASE_MSA);
    check_msa_access(ctx);

    switch (MASK_MSA_MINOR(opcode)) {
    case OPC_MSA_I8_00:
    case OPC_MSA_I8_01:
    case OPC_MSA_I8_02:
        gen_msa_i8(env, ctx);
        break;
    case OPC_MSA_I5_06:
    case OPC_MSA_I5_07:
        gen_msa_i5(env, ctx);
        break;
    case OPC_MSA_BIT_09:
    case OPC_MSA_BIT_0A:
        gen_msa_bit(env, ctx);
        break;
    case OPC_MSA_3R_0D:
    case OPC_MSA_3R_0E:
    case OPC_MSA_3R_0F:
    case OPC_MSA_3R_10:
    case OPC_MSA_3R_11:
    case OPC_MSA_3R_12:
    case OPC_MSA_3R_13:
    case OPC_MSA_3R_14:
    case OPC_MSA_3R_15:
        gen_msa_3r(env, ctx);
        break;
    case OPC_MSA_ELM:
        gen_msa_elm(env, ctx);
        break;
    case OPC_MSA_3RF_1A:
    case OPC_MSA_3RF_1B:
    case OPC_MSA_3RF_1C:
        gen_msa_3rf(env, ctx);
        break;
    case OPC_MSA_VEC:
        gen_msa_vec(env, ctx);
        break;
    case OPC_LD_B:
    case OPC_LD_H:
    case OPC_LD_W:
    case OPC_LD_D:
    case OPC_ST_B:
    case OPC_ST_H:
    case OPC_ST_W:
    case OPC_ST_D:
        {
            int32_t s10 = sextract32(ctx->opcode, 16, 10);
            uint8_t rs = (ctx->opcode >> 11) & 0x1f;
            uint8_t wd = (ctx->opcode >> 6) & 0x1f;
            uint8_t df = (ctx->opcode >> 0) & 0x3;

            TCGv_i32 twd = tcg_const_i32(tcg_ctx, wd);
            TCGv taddr = tcg_temp_new(tcg_ctx);
            gen_base_offset_addr(ctx, taddr, rs, s10 << df);

            switch (MASK_MSA_MINOR(opcode)) {
            case OPC_LD_B:
                gen_helper_msa_ld_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_H:
                gen_helper_msa_ld_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_W:
                gen_helper_msa_ld_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_LD_D:
                gen_helper_msa_ld_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_B:
                gen_helper_msa_st_b(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_H:
                gen_helper_msa_st_h(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_W:
                gen_helper_msa_st_w(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            case OPC_ST_D:
                gen_helper_msa_st_d(tcg_ctx, tcg_ctx->cpu_env, twd, taddr);
                break;
            }

            tcg_temp_free_i32(tcg_ctx, twd);
            tcg_temp_free(tcg_ctx, taddr);
        }
        break;
    default:
        MIPS_INVAL("MSA instruction");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }

}